

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue.h
# Opt level: O0

reentrant_put_transaction<int> * __thiscall
density::heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>::
start_reentrant_push<int>
          (reentrant_put_transaction<int> *__return_storage_ptr__,
          heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
          *this,int *i_source)

{
  reentrant_put_transaction<int> local_38;
  int *local_20;
  int *i_source_local;
  heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
  *this_local;
  
  local_20 = i_source;
  i_source_local = (int *)this;
  this_local = (heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
                *)__return_storage_ptr__;
  heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>>::
  start_reentrant_emplace<int,int>
            (&local_38,
             (heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>>
              *)this,i_source);
  heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>>::
  reentrant_put_transaction<int>::reentrant_put_transaction<int,void>
            ((reentrant_put_transaction<int> *)__return_storage_ptr__,&local_38);
  reentrant_put_transaction<int>::~reentrant_put_transaction(&local_38);
  return __return_storage_ptr__;
}

Assistant:

reentrant_put_transaction<typename std::decay<ELEMENT_TYPE>::type>
          start_reentrant_push(ELEMENT_TYPE && i_source)
        {
            return start_reentrant_emplace<typename std::decay<ELEMENT_TYPE>::type>(
              std::forward<ELEMENT_TYPE>(i_source));
        }